

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int EXRNumLevels(EXRImage *exr_image)

{
  EXRImage *level_image;
  int levels;
  EXRImage *exr_image_local;
  int local_4;
  
  if (exr_image == (EXRImage *)0x0) {
    local_4 = 0;
  }
  else if (exr_image->images == (uchar **)0x0) {
    levels = 1;
    level_image = exr_image;
    while (level_image = level_image->next_level, level_image != (TEXRImage *)0x0) {
      levels = levels + 1;
    }
    local_4 = levels;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int EXRNumLevels(const EXRImage* exr_image) {
  if (exr_image == NULL) return 0;
  if(exr_image->images) return 1; // scanlines
  int levels = 1;
  const EXRImage* level_image = exr_image;
  while((level_image = level_image->next_level)) ++levels;
  return levels;
}